

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  uint uVar1;
  bool bVar2;
  size_t sVar3;
  uint uVar4;
  bool bVar5;
  ostream *poVar6;
  char *__s;
  Message buffer;
  string error_message;
  DummyMatchResultListener dummy;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_200;
  undefined1 local_1f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  undefined1 local_198 [112];
  ios_base local_128 [264];
  
  if (this->spawned_ != true) {
    return false;
  }
  (*(this->super_DeathTest)._vptr_DeathTest[6])(&local_1d8,this);
  Message::Message((Message *)&local_200);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_200._M_head_impl + 0x10),"Death test: ",0xc);
  __s = this->statement_;
  poVar6 = (ostream *)(local_200._M_head_impl + 0x10);
  if (__s == (char *)0x0) {
    sVar3 = 6;
    __s = "(null)";
  }
  else {
    sVar3 = strlen(__s);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,__s,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_200._M_head_impl + 0x10),"\n",1);
  switch(this->outcome_) {
  case DIED:
    if (!status_ok) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_200._M_head_impl + 0x10),
                 "    Result: died but not with expected exit code:\n",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_200._M_head_impl + 0x10),"            ",0xc);
      uVar1 = this->status_;
      Message::Message((Message *)local_1f8);
      uVar4 = uVar1 & 0x7f;
      if (uVar4 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1f8._0_8_ + 0x10),"Exited with exit status ",0x18);
        std::ostream::operator<<((stringstream *)(local_1f8._0_8_ + 0x10),uVar1 >> 8 & 0xff);
      }
      else if (0x1ffffff < (int)(uVar4 * 0x1000000 + 0x1000000)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1f8._0_8_ + 0x10),"Terminated by signal ",0x15);
        std::ostream::operator<<((stringstream *)(local_1f8._0_8_ + 0x10),uVar4);
      }
      if ((char)uVar1 < '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1f8._0_8_ + 0x10)," (core dumped)",0xe);
      }
      StringStreamToString((string *)local_198,(stringstream *)local_1f8._0_8_);
      if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )local_1f8._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1f8._0_8_ + 8))();
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_200._M_head_impl + 0x10),(char *)local_198._0_8_,local_198._8_8_)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_200._M_head_impl + 0x10),"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_200._M_head_impl + 0x10),"Actual msg:\n",0xc);
      FormatDeathTestOutput((string *)local_1f8,&local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_200._M_head_impl + 0x10),(char *)local_1f8._0_8_,local_1f8._8_8_)
      ;
      if ((stringstream *)local_1f8._0_8_ != (stringstream *)(local_1f8 + 0x10)) {
        operator_delete((void *)local_1f8._0_8_);
      }
      break;
    }
    local_198._8_8_ = (ostream *)0x0;
    local_198._0_8_ = &PTR__MatchResultListener_010d9438;
    bVar2 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            ::MatchAndExplain(&(this->matcher_).
                               super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              ,&local_1d8,(MatchResultListener *)local_198);
    bVar5 = true;
    if (bVar2) goto LAB_00bf5759;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::DescribeTo(&(this->matcher_).
                  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 ,(ostream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_200._M_head_impl + 0x10),
               "    Result: died but not with expected error.\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_200._M_head_impl + 0x10),"  Expected: ",0xc);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_200._M_head_impl + 0x10),(char *)local_1f8._0_8_,local_1f8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_200._M_head_impl + 0x10),"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_200._M_head_impl + 0x10),"Actual msg:\n",0xc);
    FormatDeathTestOutput(&local_1b8,&local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_200._M_head_impl + 0x10),local_1b8._M_dataplus._M_p,
               local_1b8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if (local_1f8._0_8_ != (long)local_1f8 + 0x10) {
      operator_delete((void *)local_1f8._0_8_);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
    goto LAB_00bf5757;
  case LIVED:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_200._M_head_impl + 0x10),"    Result: failed to die.\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_200._M_head_impl + 0x10)," Error msg:\n",0xc);
    FormatDeathTestOutput((string *)local_198,&local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_200._M_head_impl + 0x10),(char *)local_198._0_8_,local_198._8_8_);
    break;
  case RETURNED:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_200._M_head_impl + 0x10),
               "    Result: illegal return in test statement.\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_200._M_head_impl + 0x10)," Error msg:\n",0xc);
    FormatDeathTestOutput((string *)local_198,&local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_200._M_head_impl + 0x10),(char *)local_198._0_8_,local_198._8_8_);
    break;
  case THREW:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_200._M_head_impl + 0x10),"    Result: threw an exception.\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_200._M_head_impl + 0x10)," Error msg:\n",0xc);
    FormatDeathTestOutput((string *)local_198,&local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_200._M_head_impl + 0x10),(char *)local_198._0_8_,local_198._8_8_);
    break;
  default:
    GTestLog::GTestLog((GTestLog *)local_198,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/src/gtest-death-test.cc"
                       ,0x268);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DeathTest::Passed somehow called before conclusion of test",
               0x3a);
    GTestLog::~GTestLog((GTestLog *)local_198);
    goto LAB_00bf5757;
  }
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_);
  }
LAB_00bf5757:
  bVar5 = false;
LAB_00bf5759:
  StringStreamToString((string *)local_198,local_200._M_head_impl);
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_);
  }
  if (local_200._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_200._M_head_impl + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  return bVar5;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned()) return false;

  const std::string error_message = GetErrorLogs();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n"
             << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n"
             << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n"
             << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        if (matcher_.Matches(error_message)) {
          success = true;
        } else {
          std::ostringstream stream;
          matcher_.DescribeTo(&stream);
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << stream.str() << "\n"
                 << "Actual msg:\n"
                 << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n"
               << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}